

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntBe21At2(uint8_t *buf)

{
  return (ulong)((*buf & 0x3f) << 0xf | (uint)buf[1] << 7 | (uint)(buf[2] >> 1));
}

Assistant:

std::uint64_t readFlUIntBe21At2(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 7;
    res |= (buf[2] >> 1);
    res &= UINT64_C(0x1fffff);
    return res;
}